

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool absl::lts_20250127::StartsWith(string_view text,string_view prefix)

{
  bool bVar1;
  ulong __n;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = text._M_str;
  local_20._M_len = text._M_len;
  __n = prefix._M_len;
  if (__n == 0) {
    bVar1 = true;
  }
  else if (local_20._M_len < __n) {
    bVar1 = false;
  }
  else {
    __x = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_20,0,__n);
    bVar1 = std::operator==(__x,prefix);
  }
  return bVar1;
}

Assistant:

inline constexpr bool StartsWith(absl::string_view text,
                                 absl::string_view prefix) noexcept {
  if (prefix.empty()) {
    return true;
  }
  if (text.size() < prefix.size()) {
    return false;
  }
  absl::string_view possible_match = text.substr(0, prefix.size());

  return possible_match == prefix;
}